

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *
__thiscall
anurbs::NurbsSurfaceGeometry<2L>::shape_functions_at
          (pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           *__return_storage_ptr__,NurbsSurfaceGeometry<2L> *this,double u,double v,Index order)

{
  allocator<long> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *dataPtr;
  size_type __n;
  Index IVar4;
  Index IVar5;
  reference plVar6;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_330;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_2f0;
  Index local_2e8;
  Index poleIndex;
  Index pole_v;
  Index pole_u;
  Index j;
  Index i;
  iterator it;
  undefined1 local_2b0 [8];
  vector<long,_std::allocator<long>_> indices;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_270;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_248;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_208;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_1e0;
  Stride<0,_0> local_1b2;
  undefined1 local_1b0 [8];
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> weights;
  undefined1 local_180 [8];
  NurbsSurfaceShapeFunction shape_function;
  Index order_local;
  double v_local;
  double u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  shape_function.m_first_nonzero_pole_v = order;
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  iVar3 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  NurbsSurfaceShapeFunction::NurbsSurfaceShapeFunction
            ((NurbsSurfaceShapeFunction *)local_180,CONCAT44(extraout_var,iVar2),
             CONCAT44(extraout_var_00,iVar3),shape_function.m_first_nonzero_pole_v);
  bVar1 = is_rational(this);
  if (bVar1) {
    dataPtr = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::data
                        (&(this->m_weights).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
    IVar5 = nb_poles_u(this);
    IVar4 = nb_poles_v(this);
    Eigen::Stride<0,_0>::Stride(&local_1b2);
    Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
               local_1b0,dataPtr,IVar5,IVar4,&local_1b2);
    knots_u(&local_1e0,this);
    knots_v(&local_208,this);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_248,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_1b0,(type *)0x0);
    NurbsSurfaceShapeFunction::compute
              ((NurbsSurfaceShapeFunction *)local_180,&local_1e0,&local_208,&local_248,u,v);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
              (&local_248);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_208);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_1e0);
  }
  else {
    knots_u(&local_270,this);
    knots_v((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
            &indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage,this);
    NurbsSurfaceShapeFunction::compute
              ((NurbsSurfaceShapeFunction *)local_180,&local_270,
               (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
               &indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,u,v);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              ((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
               &indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_270);
  }
  __n = NurbsSurfaceShapeFunction::nb_nonzero_poles((NurbsSurfaceShapeFunction *)local_180);
  this_00 = (allocator<long> *)((long)&it._M_current + 7);
  std::allocator<long>::allocator(this_00);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_2b0,__n,this_00);
  std::allocator<long>::~allocator((allocator<long> *)((long)&it._M_current + 7));
  i = (Index)std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)local_2b0);
  j = 0;
  while( true ) {
    IVar5 = j;
    IVar4 = NurbsSurfaceShapeFunction::nb_nonzero_poles_u((NurbsSurfaceShapeFunction *)local_180);
    if (IVar4 <= IVar5) break;
    pole_u = 0;
    while( true ) {
      IVar5 = pole_u;
      IVar4 = NurbsSurfaceShapeFunction::nb_nonzero_poles_v((NurbsSurfaceShapeFunction *)local_180);
      if (IVar4 <= IVar5) break;
      IVar5 = NurbsSurfaceShapeFunction::first_nonzero_pole_u
                        ((NurbsSurfaceShapeFunction *)local_180);
      pole_v = IVar5 + j;
      IVar5 = NurbsSurfaceShapeFunction::first_nonzero_pole_v
                        ((NurbsSurfaceShapeFunction *)local_180);
      poleIndex = IVar5 + pole_u;
      IVar5 = nb_poles_u(this);
      IVar4 = nb_poles_v(this);
      IVar5 = Math::single_index(IVar5,IVar4,pole_v,poleIndex);
      local_2e8 = IVar5;
      local_2f0 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&i,0);
      plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_2f0);
      *plVar6 = IVar5;
      pole_u = pole_u + 1;
    }
    j = j + 1;
  }
  NurbsSurfaceShapeFunction::values(&local_330,(NurbsSurfaceShapeFunction *)local_180);
  std::pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::
  pair<std::vector<long,_std::allocator<long>_>_&,_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_true>
            (__return_storage_ptr__,(vector<long,_std::allocator<long>_> *)local_2b0,&local_330);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_330);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_2b0);
  NurbsSurfaceShapeFunction::~NurbsSurfaceShapeFunction((NurbsSurfaceShapeFunction *)local_180);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<Index>, Eigen::MatrixXd>
    shape_functions_at(const double u, const double v, const Index order) const
    {
        NurbsSurfaceShapeFunction shape_function(degree_u(), degree_v(), order);

        if (is_rational()) {
            Eigen::Map<const Eigen::MatrixXd> weights(m_weights.data(), nb_poles_u(), nb_poles_v());
            shape_function.compute(knots_u(), knots_v(), weights, u, v);
        } else {
            shape_function.compute(knots_u(), knots_v(), u, v);
        }

        std::vector<Index> indices(shape_function.nb_nonzero_poles());
        auto it = indices.begin();

        for (Index i = 0; i < shape_function.nb_nonzero_poles_u(); i++) {
            for (Index j = 0; j < shape_function.nb_nonzero_poles_v(); j++) {
                const Index pole_u = shape_function.first_nonzero_pole_u() + i;
                const Index pole_v = shape_function.first_nonzero_pole_v() + j;

                Index poleIndex = Math::single_index(nb_poles_u(), nb_poles_v(), pole_u, pole_v);

                *(it++) = poleIndex;
            }
        }

        return {indices, shape_function.values()};
    }